

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O3

VRMatrix4 *
MinVR::VRMatrix4::rotation(VRMatrix4 *__return_storage_ptr__,VRPoint3 *p,VRVector3 *v,float a)

{
  float __y;
  float radians;
  float fVar1;
  VRMatrix4 B;
  VRMatrix4 C;
  VRMatrix4 A;
  VRMatrix4 transBack;
  VRMatrix4 invB;
  VRMatrix4 invA;
  VRMatrix4 transToOrigin;
  VRMatrix4 local_380;
  VRMatrix4 local_338;
  VRMatrix4 local_2f0;
  VRMatrix4 local_2a8;
  VRMatrix4 local_258;
  VRMatrix4 local_210;
  VRMatrix4 local_1c8;
  VRMatrix4 local_180;
  VRMatrix4 local_138;
  VRMatrix4 local_f0;
  VRMatrix4 local_a8;
  VRMatrix4 local_60;
  
  fVar1 = v->x;
  __y = v->z;
  radians = atan2f(__y,fVar1);
  fVar1 = atan2f(v->y,SQRT(fVar1 * fVar1 + __y * __y));
  VRVector3::VRVector3((VRVector3 *)&local_2f0,p->x,p->y,p->z);
  VRVector3::VRVector3((VRVector3 *)&local_338,-local_2f0.m[0],-local_2f0.m[1],-local_2f0.m[2]);
  local_258.m[10] = local_338.m[0];
  local_258.m[0xb] = local_338.m[1];
  local_258.m[0xc] = local_338.m[2];
  local_258.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible = (_func_int **)0x3f800000;
  local_258.m[0] = 0.0;
  local_258.m[1] = 0.0;
  local_258.m[2] = 0.0;
  local_258.m[3] = 1.0;
  local_258.m[4] = 0.0;
  local_258.m[5] = 0.0;
  local_258.m[6] = 0.0;
  local_258.m[7] = 0.0;
  local_258.m[8] = 1.0;
  local_258.m[9] = 0.0;
  local_258.m[0xd] = 1.0;
  VRMatrix4(&local_60,(float *)&local_258);
  VRVector3::~VRVector3((VRVector3 *)&local_338);
  VRVector3::~VRVector3((VRVector3 *)&local_2f0);
  rotationY(&local_258,radians);
  rotationZ(&local_338,-fVar1);
  rotationX(&local_2f0,a);
  rotationY(&local_a8,-radians);
  rotationZ(&local_f0,fVar1);
  VRVector3::VRVector3((VRVector3 *)&local_380,p->x,p->y,p->z);
  local_2a8.m[10] = local_380.m[0];
  local_2a8.m[0xb] = local_380.m[1];
  local_2a8.m[0xc] = local_380.m[2];
  local_2a8.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible = (_func_int **)0x3f800000;
  local_2a8.m[0] = 0.0;
  local_2a8.m[1] = 0.0;
  local_2a8.m[2] = 0.0;
  local_2a8.m[3] = 1.0;
  local_2a8.m[4] = 0.0;
  local_2a8.m[5] = 0.0;
  local_2a8.m[6] = 0.0;
  local_2a8.m[7] = 0.0;
  local_2a8.m[8] = 1.0;
  local_2a8.m[9] = 0.0;
  local_2a8.m[0xd] = 1.0;
  VRMatrix4(&local_138,(float *)&local_2a8);
  VRVector3::~VRVector3((VRVector3 *)&local_380);
  operator*(&local_210,&local_138,&local_a8);
  operator*(&local_1c8,&local_210,&local_f0);
  operator*(&local_180,&local_1c8,&local_2f0);
  operator*(&local_380,&local_180,&local_338);
  operator*(&local_2a8,&local_380,&local_258);
  operator*(__return_storage_ptr__,&local_2a8,&local_60);
  ~VRMatrix4(&local_2a8);
  ~VRMatrix4(&local_380);
  ~VRMatrix4(&local_180);
  ~VRMatrix4(&local_1c8);
  ~VRMatrix4(&local_210);
  ~VRMatrix4(&local_138);
  ~VRMatrix4(&local_f0);
  ~VRMatrix4(&local_a8);
  ~VRMatrix4(&local_2f0);
  ~VRMatrix4(&local_338);
  ~VRMatrix4(&local_258);
  ~VRMatrix4(&local_60);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::rotation(const VRPoint3& p, const VRVector3& v, const float a) {
  // Translate to origin from point p
  const float vZ = v[2];
  const float vX = v[0];
  const float theta = atan2(vZ, vX);
  const float phi   = -atan2((float)v[1], (float)sqrt(vX * vX + vZ * vZ));

  const VRMatrix4 transToOrigin = VRMatrix4::translation(-1.0*VRVector3(p[0], p[1], p[2]));
  const VRMatrix4 A = VRMatrix4::rotationY(theta);
  const VRMatrix4 B = VRMatrix4::rotationZ(phi);
  const VRMatrix4 C = VRMatrix4::rotationX(a);
  const VRMatrix4 invA = VRMatrix4::rotationY(-theta);
  const VRMatrix4 invB = VRMatrix4::rotationZ(-phi);
  const VRMatrix4 transBack = VRMatrix4::translation(VRVector3(p[0], p[1], p[2]));
  
  return transBack * invA * invB * C * B * A * transToOrigin;
}